

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

_Bool use_aggressive_subpel_search_method
                (MACROBLOCK *x,_Bool use_adaptive_subpel_search,_Bool fullpel_performed_well)

{
  int qband;
  _Bool fullpel_performed_well_local;
  _Bool use_adaptive_subpel_search_local;
  MACROBLOCK *x_local;
  _Bool local_1;
  
  if (use_adaptive_subpel_search) {
    if ((x->qindex >> 6 < 1) ||
       (((!fullpel_performed_well && (kLowSad < (x->content_state_sb).source_sad_nonrd)) &&
        (99 < x->source_variance)))) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool use_aggressive_subpel_search_method(MACROBLOCK *x,
                                                bool use_adaptive_subpel_search,
                                                bool fullpel_performed_well) {
  if (!use_adaptive_subpel_search) return false;
  const int qband = x->qindex >> (QINDEX_BITS - 2);
  assert(qband < 4);
  if ((qband > 0) && (fullpel_performed_well ||
                      (x->content_state_sb.source_sad_nonrd <= kLowSad) ||
                      (x->source_variance < 100)))
    return true;
  return false;
}